

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

void dukglue_read<std::vector<Dog*,std::allocator<Dog*>>>
               (duk_context *ctx,duk_idx_t arg_idx,vector<Dog_*,_std::allocator<Dog_*>_> *out)

{
  duk_idx_t in_ECX;
  vector<Dog_*,_std::allocator<Dog_*>_> local_38;
  vector<Dog_*,_std::allocator<Dog_*>_> *local_20;
  vector<Dog_*,_std::allocator<Dog_*>_> *out_local;
  duk_context *pdStack_10;
  duk_idx_t arg_idx_local;
  duk_context *ctx_local;
  
  local_20 = out;
  out_local._4_4_ = arg_idx;
  pdStack_10 = ctx;
  dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
  read<std::vector<Dog*,std::allocator<Dog*>>>
            (&local_38,(DukType<std::vector<Dog*,std::allocator<Dog*>>> *)ctx,
             (duk_context *)(ulong)(uint)arg_idx,in_ECX);
  std::vector<Dog_*,_std::allocator<Dog_*>_>::operator=(local_20,&local_38);
  std::vector<Dog_*,_std::allocator<Dog_*>_>::~vector(&local_38);
  return;
}

Assistant:

void dukglue_read(duk_context* ctx, duk_idx_t arg_idx, RetT* out)
{
	// ArgStorage has some static_asserts in it that validate value types,
	// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
	typedef typename dukglue::types::ArgStorage<RetT>::type ValidateReturnType;

	using namespace dukglue::types;
	*out = DukType<typename Bare<RetT>::type>::template read<RetT>(ctx, arg_idx);
}